

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFunctions.h
# Opt level: O2

int luabridge::detail::CFunc::readOnlyError(lua_State *L)

{
  int iVar1;
  char *__rhs;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_78,&local_98,"\'");
  __rhs = lua_tolstring(L,-0xf4629,(size_t *)0x0);
  std::operator+(&local_58,&local_78,__rhs);
  std::operator+(&local_38,&local_58,"\' is read-only");
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  iVar1 = luaL_error(L,local_98._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_98);
  return iVar1;
}

Assistant:

static int readOnlyError(lua_State* L)
    {
        std::string s;

        s = s + "'" + lua_tostring(L, lua_upvalueindex(1)) + "' is read-only";

        return luaL_error(L, s.c_str());
    }